

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall
wabt::OptionParser::Option::Option
          (Option *this,char short_name,string *long_name,string *metavar,HasArgument has_argument,
          string *help,Callback *callback)

{
  this->short_name = short_name;
  std::__cxx11::string::string((string *)&this->long_name,(string *)long_name);
  std::__cxx11::string::string((string *)&this->metavar,(string *)metavar);
  this->has_argument = has_argument == Yes;
  std::__cxx11::string::string((string *)&this->help,(string *)help);
  std::function<void_(const_char_*)>::function(&this->callback,callback);
  return;
}

Assistant:

OptionParser::Option::Option(char short_name,
                             const std::string& long_name,
                             const std::string& metavar,
                             HasArgument has_argument,
                             const std::string& help,
                             const Callback& callback)
    : short_name(short_name),
      long_name(long_name),
      metavar(metavar),
      has_argument(has_argument == HasArgument::Yes),
      help(help),
      callback(callback) {}